

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  thread reader;
  thread writer;
  thread local_28;
  thread local_20;
  
  if (1 < argc) {
    g_maxCount = atoi(argv[1]);
  }
  clock();
  std::thread::thread<int(&)(),,void>(&local_20,write_proc);
  std::thread::thread<int(&)(),,void>(&local_28,read_proc);
  std::thread::join();
  std::thread::join();
  clock();
  __s = *argv;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106078);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  duration:",0xb);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((local_28._M_id._M_thread == 0) && (local_20._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc,char *argv[])
{
    if (argc >=2 ){
	g_maxCount = atoi(argv[1]); 
	//printf("max count is %d\n",g_maxCount); 
    }


    clock_t start = clock();

    std::thread writer(write_proc); 
    std::thread reader(read_proc); 
    reader.join(); 
    writer.join(); 

    clock_t finish = clock();
    std::cout<<argv[0] << "  duration:"<<finish - start<<"ms"<<std::endl;
    return 0; 

}